

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O2

void warnf(Configurable *config,char *fmt,...)

{
  long lVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ushort **ppuVar5;
  long lVar6;
  char *__s;
  va_list ap;
  char print_buffer [256];
  
  if (config->mute == false) {
    __s = print_buffer;
    uVar4 = curl_mvsnprintf(__s,0x100,fmt);
    while (0 < (int)uVar4) {
      fputs("Warning: ",(FILE *)config->errors);
      if (uVar4 < 0x47) {
        fputs(__s,(FILE *)config->errors);
        uVar4 = 0;
      }
      else {
        ppuVar5 = __ctype_b_loc();
        lVar6 = 0x46;
        do {
          lVar1 = lVar6 + -1;
          if (lVar6 == 1) break;
          lVar3 = lVar6 + -1;
          lVar6 = lVar1;
        } while (((*ppuVar5)[(byte)__s[lVar3]] & 0x2000) == 0);
        iVar2 = (int)lVar1;
        if (lVar1 == 0) {
          iVar2 = 0x45;
        }
        fwrite(__s,(long)iVar2 + 1,1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        __s = __s + (long)iVar2 + 1;
        uVar4 = uVar4 - iVar2;
      }
    }
  }
  return;
}

Assistant:

void warnf(struct Configurable *config, const char *fmt, ...)
{
  if(!config->mute) {
    va_list ap;
    int len;
    char *ptr;
    char print_buffer[256];

    va_start(ap, fmt);
    len = vsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    va_end(ap);

    ptr = print_buffer;
    while(len > 0) {
      fputs(WARN_PREFIX, config->errors);

      if(len > (int)WARN_TEXTWIDTH) {
        int cut = WARN_TEXTWIDTH-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = WARN_TEXTWIDTH-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut+1; /* skip the space too */
        len -= cut;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
  }
}